

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffpunt(fitsfile *fptr,char *keyname,char *unit,int *status)

{
  int iVar1;
  int *in_RCX;
  char *in_RDX;
  size_t len;
  char *loc;
  char card [81];
  char value [71];
  char newcomm [73];
  char oldcomm [73];
  size_t local_188;
  char *local_180;
  int *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  fitsfile *in_stack_fffffffffffffee8;
  int *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  fitsfile *in_stack_ffffffffffffff00;
  char local_c8 [64];
  int *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  char in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff89;
  char *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  int local_4;
  
  if (*in_RCX < 1) {
    iVar1 = ffgkey(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                   in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    if (iVar1 < 1) {
      if (*in_RDX == '\0') {
        local_c8[0] = '\0';
        local_188 = 0x48;
      }
      else {
        strcpy(local_c8,"[");
        strncat(local_c8,in_RDX,0x2d);
        strcat(local_c8,"] ");
        local_188 = strlen(local_c8);
        local_188 = 0x48 - local_188;
      }
      if (in_stack_ffffffffffffff88 == '[') {
        local_180 = strchr(&stack0xffffffffffffff88,0x5d);
        if (local_180 == (char *)0x0) {
          strncat(local_c8,&stack0xffffffffffffff88,local_188);
        }
        else {
          do {
            local_180 = local_180 + 1;
          } while (*local_180 == ' ');
          strncat(local_c8,local_180,local_188);
        }
      }
      else {
        strncat(local_c8,&stack0xffffffffffffff88,local_188);
      }
      ffmkky(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             (char *)CONCAT71(in_stack_ffffffffffffff89,in_stack_ffffffffffffff88),
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      ffmkey(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      local_4 = *in_RCX;
    }
    else {
      local_4 = *in_RCX;
    }
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffpunt(fitsfile *fptr,     /* I - FITS file pointer   */
           const char *keyname,/* I - keyword name        */
           const char *unit,   /* I - keyword unit string */
           int *status)        /* IO - error status       */
/*
    Write (put) the units string into the comment field of the existing keyword.
    This routine uses a  FITS convention  in which the units are enclosed in 
    square brackets following the '/' comment field delimiter, e.g.:

    KEYWORD =                   12 / [kpc] comment string goes here
*/
{
    char oldcomm[FLEN_COMMENT];
    char newcomm[FLEN_COMMENT];
    char value[FLEN_VALUE];
    char card[FLEN_CARD];
    char *loc;
    size_t len;
 
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgkey(fptr, keyname, value, oldcomm, status) > 0)
        return(*status);

    /* copy the units string to the new comment string if not null */
    if (*unit)
    {
        strcpy(newcomm, "[");
        strncat(newcomm, unit, 45);  /* max allowed length is about 45 chars */
        strcat(newcomm, "] ");
        len = strlen(newcomm);  
        len = FLEN_COMMENT - len - 1;  /* amount of space left in the field */
    }
    else
    {
        newcomm[0] = '\0';
        len = FLEN_COMMENT - 1;
    }

    if (oldcomm[0] == '[')  /* check for existing units field */
    {
        loc = strchr(oldcomm, ']');  /* look for the closing bracket */
        if (loc)
        {
            loc++;
            while (*loc == ' ')   /* skip any blank spaces */
               loc++;

            strncat(newcomm, loc, len);  /* concat remainder of comment */
        }
        else
        {
            strncat(newcomm, oldcomm, len);  /* append old comment onto new */
        }
    }
    else
    {
        strncat(newcomm, oldcomm, len);
    }

    ffmkky(keyname, value, newcomm, card, status);  /* construct the card */
    ffmkey(fptr, card, status);  /* rewrite with new units string */

    return(*status);
}